

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O1

void helper_retry_sparc64(CPUSPARCState_conflict1 *env)

{
  byte bVar1;
  uint64_t uVar2;
  uint uVar3;
  trap_state *ptVar4;
  uint uVar5;
  
  ptVar4 = cpu_tsptr_sparc64(env);
  env->pc = ptVar4->tpc;
  env->npc = ptVar4->tnpc;
  uVar2 = ptVar4->tstate;
  uVar5 = (uint)(uVar2 >> 0x20);
  env->xcc = (uVar5 & 0xfffffff0) << 0x10;
  env->psr = (uVar5 & 0xf) << 0x14;
  env->cc_op = 1;
  env->asi = (uint)(uVar2 >> 0x18) & 0xff;
  cpu_change_pstate_sparc64(env,(uint)uVar2 >> 8 & 0xf3f);
  bVar1 = (byte)ptVar4->tstate;
  uVar3 = (uint)bVar1;
  uVar5 = env->nwindows;
  if (uVar5 <= bVar1) {
    uVar3 = (uint)bVar1 % uVar5;
  }
  cpu_set_cwp_sparc64(env,uVar5 + ~uVar3);
  if (((env->def).features & 0x800) != 0) {
    uVar5 = (uint)(ptVar4->tstate >> 0x28) & 7;
    env->hpstate = env->htstate[env->tl];
    cpu_gl_switch_gregs_sparc64(env,uVar5);
    env->gl = uVar5;
  }
  env->tl = env->tl - 1;
  return;
}

Assistant:

void helper_retry(CPUSPARCState *env)
{
    trap_state *tsptr = cpu_tsptr(env);

    env->pc = tsptr->tpc;
    env->npc = tsptr->tnpc;
    cpu_put_ccr(env, tsptr->tstate >> 32);
    env->asi = (tsptr->tstate >> 24) & 0xff;
    cpu_change_pstate(env, (tsptr->tstate >> 8) & 0xf3f);
    cpu_put_cwp64(env, tsptr->tstate & 0xff);
    if (cpu_has_hypervisor(env)) {
        uint32_t new_gl = (tsptr->tstate >> 40) & 7;
        env->hpstate = env->htstate[env->tl];
        cpu_gl_switch_gregs(env, new_gl);
        env->gl = new_gl;
    }
    env->tl--;

    if (cpu_interrupts_enabled(env)) {
        // cpu_check_irqs(env);
    }
}